

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

natwm_error parser_read_item(parser *parser,char **key_result,config_value **value_result)

{
  char *__ptr;
  char *__ptr_00;
  natwm_error nVar1;
  config_value *pcVar2;
  undefined8 in_R9;
  undefined8 uVar3;
  char *local_38;
  char *value;
  char *key;
  
  uVar3 = 0x106c6e;
  value = (char *)0x0;
  nVar1 = parser_read_key(parser,&value,(size_t *)0x0);
  if (nVar1 == NO_ERROR) {
    local_38 = (char *)0x0;
    nVar1 = parser_read_value(parser,&local_38,(size_t *)0x0);
    __ptr = local_38;
    if (nVar1 == NO_ERROR) {
      pcVar2 = parser_parse_value(parser,local_38);
      __ptr_00 = value;
      if (pcVar2 == (config_value *)0x0) {
        internal_logger(natwm_logger,LEVEL_ERROR,"Failed to save \'%s\' - Line %zu",value,
                        parser->line_num,in_R9,uVar3);
        free(__ptr_00);
        free(__ptr);
        nVar1 = GENERIC_ERROR;
      }
      else {
        *key_result = value;
        *value_result = pcVar2;
        nVar1 = NO_ERROR;
      }
    }
    else {
      free(value);
    }
  }
  return nVar1;
}

Assistant:

enum natwm_error parser_read_item(struct parser *parser, char **key_result,
                                  struct config_value **value_result)
{
        enum natwm_error err = GENERIC_ERROR;
        char *key = NULL;

        err = parser_read_key(parser, &key, NULL);

        if (err != NO_ERROR) {
                return err;
        }

        char *value = NULL;

        err = parser_read_value(parser, &value, NULL);

        if (err != NO_ERROR) {
                free(key);

                return err;
        }

        struct config_value *config_value = parser_parse_value(parser, value);

        if (config_value == NULL) {
                LOG_ERROR(natwm_logger, "Failed to save '%s' - Line %zu", key, parser->line_num);

                free(key);
                free(value);

                return GENERIC_ERROR;
        }

        *key_result = key;
        *value_result = config_value;

        return NO_ERROR;
}